

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall sznet::net::EventLoop::removeChannel(EventLoop *this,Channel *channel)

{
  Poller *pPVar1;
  bool bVar2;
  __normal_iterator<sznet::net::Channel_**,_std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>_>
  _Var3;
  Channel *local_18;
  Channel *channel_local;
  
  local_18 = channel;
  if (channel->m_loop != this) {
    __assert_fail("channel->ownerLoop() == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                  ,0xd0,"void sznet::net::EventLoop::removeChannel(Channel *)");
  }
  bVar2 = isInLoopThread(this);
  if (!bVar2) {
    abortNotInLoopThread(this);
  }
  if ((this->m_eventHandling == true) && (this->m_currentActiveChannel != local_18)) {
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<sznet::net::Channel**,std::vector<sznet::net::Channel*,std::allocator<sznet::net::Channel*>>>,__gnu_cxx::__ops::_Iter_equals_val<sznet::net::Channel*const>>
                      ((this->m_activeChannels).
                       super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->m_activeChannels).
                       super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_18);
    if (_Var3._M_current !=
        (this->m_activeChannels).
        super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("m_currentActiveChannel == channel || std::find(m_activeChannels.begin(), m_activeChannels.end(), channel) == m_activeChannels.end()"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                    ,0xd4,"void sznet::net::EventLoop::removeChannel(Channel *)");
    }
  }
  pPVar1 = (this->m_poller)._M_t.
           super___uniq_ptr_impl<sznet::net::Poller,_std::default_delete<sznet::net::Poller>_>._M_t.
           super__Tuple_impl<0UL,_sznet::net::Poller_*,_std::default_delete<sznet::net::Poller>_>.
           super__Head_base<0UL,_sznet::net::Poller_*,_false>._M_head_impl;
  (*pPVar1->_vptr_Poller[4])(pPVar1,local_18);
  return;
}

Assistant:

void EventLoop::removeChannel(Channel* channel)
{
	assert(channel->ownerLoop() == this);
	assertInLoopThread();
	if (m_eventHandling)
	{
		assert(m_currentActiveChannel == channel || std::find(m_activeChannels.begin(), m_activeChannels.end(), channel) == m_activeChannels.end());
	}
	m_poller->removeChannel(channel);
}